

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expint_e1.c
# Opt level: O0

double xc_expint_e1_impl(double x,int scale)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double s_3;
  double s_2;
  double scale_factor_1;
  double scale_factor;
  double s_1;
  double s;
  double e1;
  double xmax;
  double xmaxt;
  double local_f0;
  double local_d8;
  double local_b8;
  double local_a0;
  double local_90;
  double local_78;
  double local_68;
  double local_28;
  double local_8;
  
  dVar1 = log(2.2250738585072014e-308);
  dVar2 = log(-dVar1);
  dVar2 = -dVar1 - dVar2;
  local_28 = 0.0;
  local_8 = in_XMM0_Qa;
  if (in_EDI == 0) {
    local_68 = dVar2;
    if (in_XMM0_Qa < dVar2) {
      local_68 = in_XMM0_Qa;
    }
    local_8 = local_68;
  }
  if (-10.0 < local_8) {
    if (-4.0 < local_8) {
      if (-1.0 < local_8) {
        if ((local_8 != 0.0) || (NAN(local_8))) {
          if (1.0 < local_8) {
            if (4.0 < local_8) {
              if ((local_8 <= dVar2) || (in_EDI != 0)) {
                if (in_EDI == 0) {
                  local_f0 = exp(-local_8);
                }
                else {
                  local_f0 = 1.0;
                }
                dVar1 = xc_cheb_eval(8.0 / local_8 - 1.0,AE14_data,0x1a);
                local_28 = (1.0 / local_8) * local_f0 * (dVar1 + 1.0);
              }
              else {
                fprintf(_stderr,"Argument %14.10le is larger than xmax=%14.10le in expint_e1\n",
                        local_8,SUB84(dVar2,0));
              }
            }
            else {
              if (in_EDI == 0) {
                local_d8 = exp(-local_8);
              }
              else {
                local_d8 = 1.0;
              }
              dVar1 = xc_cheb_eval((8.0 / local_8 - 5.0) / 3.0,AE13_data,0x19);
              local_28 = (1.0 / local_8) * local_d8 * (dVar1 + 1.0);
            }
          }
          else {
            if (in_EDI == 0) {
              local_b8 = 1.0;
            }
            else {
              local_b8 = exp(local_8);
            }
            dVar1 = log(ABS(local_8));
            dVar2 = xc_cheb_eval(local_8,E12_data,0x10);
            local_28 = local_b8 * ((-dVar1 - 0.6875) + local_8 + dVar2);
          }
        }
        else {
          fprintf(_stderr,"Argument cannot be 0.0 in expint_e1\n");
        }
      }
      else {
        if (in_EDI == 0) {
          local_a0 = 1.0;
        }
        else {
          local_a0 = exp(local_8);
        }
        dVar1 = log(ABS(local_8));
        dVar2 = xc_cheb_eval((local_8 + local_8 + 5.0) / 3.0,E11_data,0x13);
        local_28 = local_a0 * (-dVar1 + dVar2);
      }
    }
    else {
      if (in_EDI == 0) {
        local_90 = exp(-local_8);
      }
      else {
        local_90 = 1.0;
      }
      dVar1 = xc_cheb_eval((40.0 / local_8 + 7.0) / 3.0,AE12_data,0x19);
      local_28 = (1.0 / local_8) * local_90 * (dVar1 + 1.0);
    }
  }
  else {
    if (in_EDI == 0) {
      local_78 = exp(-local_8);
    }
    else {
      local_78 = 1.0;
    }
    dVar1 = xc_cheb_eval(20.0 / local_8 + 1.0,AE11_data,0x27);
    local_28 = (1.0 / local_8) * local_78 * (dVar1 + 1.0);
  }
  return local_28;
}

Assistant:

GPU_FUNCTION double xc_expint_e1_impl(double x, const int scale){
  const double xmaxt = -LOG_DBL_MIN;        /* XMAXT = -log (R1MACH(1)) */
  const double xmax  = xmaxt - log(xmaxt);    /* XMAX = XMAXT - log(XMAXT) */

  double e1 = 0.0;

  /* this is a workaround not to have argument errors */
  if(! scale) x = m_min(x, xmax);

  if(x <= -10.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(20.0/x + 1.0, AE11_data, 39));
  }else if(x <= -4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((40.0/x + 7.0)/3.0, AE12_data, 25));
  }else if(x <= -1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor * (-log(fabs(x)) + xc_cheb_eval((2.0*x + 5.0)/3.0, E11_data, 19));
  }else if(x == 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Argument cannot be 0.0 in expint_e1\n");
#endif
  }else if(x <= 1.0){
    const double scale_factor = ( scale ? exp(x) : 1.0 );
    e1 = scale_factor*(-log(fabs(x)) - 0.6875 + x + xc_cheb_eval(x, E12_data, 16));
  }else if(x <= 4.0){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval((8.0/x - 5.0)/3.0, AE13_data, 25));
  }else if(x <= xmax || scale){
    const double s = 1.0/x * ( scale ? 1.0 : exp(-x) );
    e1 = s * (1.0 + xc_cheb_eval(8.0/x - 1.0, AE14_data, 26));
  }else{
#ifndef HAVE_CUDA
  fprintf(stderr, "Argument %14.10le is larger than xmax=%14.10le in expint_e1\n", x, xmax);
#endif
  }

  return e1;
}